

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O0

double eval_guided_crit<float,long,long_double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,long *Xc_ind,
                 long *Xc_indptr,double *buffer_arr,size_t *buffer_pos,bool as_relative_gain,
                 double *saved_xmedian,double *split_point,double *xmin,double *xmax,
                 GainCriterion criterion,double min_gain,MissingAction missing_action,
                 size_t *cols_use,size_t ncols_use,bool force_cols_use,double *X_row_major,
                 size_t ncols,double *Xr,size_t *Xr_ind,size_t *Xr_indptr)

{
  unsigned_long uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  unsigned_long *puVar5;
  long in_RDX;
  long in_RSI;
  double dVar6;
  undefined1 auVar7 [16];
  long in_stack_00000010;
  unsigned_long *in_stack_00000018;
  double *in_stack_00000028;
  bool in_stack_00000037;
  double in_stack_00000038;
  bool in_stack_00000047;
  undefined4 in_stack_00000048;
  undefined4 in_stack_0000004c;
  int in_stack_00000050;
  undefined4 in_stack_00000054;
  size_t in_stack_00000058;
  size_t in_stack_00000060;
  undefined1 in_stack_00000068;
  undefined7 in_stack_00000069;
  double *in_stack_000000b0;
  double *in_stack_000000b8;
  size_t *in_stack_000000c0;
  double *in_stack_000000c8;
  double *in_stack_000000d0;
  double *in_stack_000000d8;
  GainCriterion in_stack_000000e0;
  size_t ix_1;
  double xlow;
  size_t in_stack_000000f8;
  size_t idx_half;
  size_t ix;
  size_t tot;
  size_t ignored;
  undefined7 in_stack_00000120;
  unsigned_long *in_stack_fffffffffffffe78;
  unsigned_long *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  unsigned_long *in_stack_fffffffffffffea8;
  anon_class_8_1_0f1c67a0 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  size_t in_stack_fffffffffffffec0;
  size_t in_stack_fffffffffffffec8;
  size_t *in_stack_fffffffffffffed0;
  long *in_stack_fffffffffffffee0;
  double *in_stack_fffffffffffffee8;
  double local_d8;
  byte local_c9;
  ulong local_b0;
  ulong local_90;
  
  todense<float,long>(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                      CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                      (float *)in_stack_fffffffffffffeb0.buffer_arr,
                      (long *)in_stack_fffffffffffffea8,in_stack_fffffffffffffee0,
                      in_stack_fffffffffffffee8);
  uVar4 = (in_RDX - in_RSI) + 1;
  std::iota<unsigned_long*,unsigned_long>(in_stack_00000018,in_stack_00000018 + uVar4,0);
  if (in_stack_00000050 == 0x16) {
    in_stack_00000050 = 0;
    for (local_90 = 0; local_90 < uVar4; local_90 = local_90 + 1) {
      uVar2 = std::isnan(*(double *)(in_stack_00000010 + local_90 * 8));
      local_c9 = 1;
      if ((uVar2 & 1) == 0) {
        iVar3 = std::isinf(*(double *)(in_stack_00000010 + local_90 * 8));
        local_c9 = (byte)iVar3;
      }
      if ((local_c9 & 1) != 0) {
        std::
        nth_element<unsigned_long*,eval_guided_crit<float,long,long_double>(unsigned_long*,unsigned_long,unsigned_long,unsigned_long,float*,long*,long*,double*,unsigned_long*,bool,double*,double&,double&,double&,GainCriterion,double,MissingAction,unsigned_long*,unsigned_long,bool,double*,unsigned_long,double*,unsigned_long*,unsigned_long*)::_lambda(unsigned_long,unsigned_long)_1_>
                  (in_stack_fffffffffffffea8,
                   (unsigned_long *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                   (unsigned_long *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                   in_stack_fffffffffffffeb0);
        *in_stack_00000028 = *(double *)(in_stack_00000010 + in_stack_00000018[uVar4 >> 1] * 8);
        if ((uVar4 & 1) == 0) {
          puVar5 = std::max_element<unsigned_long*>
                             (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
          uVar1 = *puVar5;
          auVar7._8_4_ = (int)(uVar1 >> 0x20);
          auVar7._0_8_ = uVar1;
          auVar7._12_4_ = 0x45300000;
          dVar6 = (auVar7._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
          *in_stack_00000028 = dVar6 + (*in_stack_00000028 - dVar6) / 2.0;
        }
        for (local_b0 = 0; local_b0 < uVar4; local_b0 = local_b0 + 1) {
          uVar2 = std::isnan(*(double *)(in_stack_00000010 + local_b0 * 8));
          if (((uVar2 & 1) == 0) &&
             (uVar2 = std::isinf(*(double *)(in_stack_00000010 + local_b0 * 8)), (uVar2 & 1) == 0))
          {
            local_d8 = *(double *)(in_stack_00000010 + local_b0 * 8);
          }
          else {
            local_d8 = *in_stack_00000028;
          }
          *(double *)(in_stack_00000010 + local_b0 * 8) = local_d8;
        }
        std::iota<unsigned_long*,unsigned_long>(in_stack_00000018,in_stack_00000018 + uVar4,0);
        break;
      }
    }
  }
  dVar6 = eval_guided_crit<double,long_double>
                    ((size_t *)CONCAT71(in_stack_00000069,in_stack_00000068),in_stack_00000060,
                     in_stack_00000058,(double *)CONCAT44(in_stack_00000054,in_stack_00000050),
                     (double *)CONCAT44(in_stack_0000004c,in_stack_00000048),in_stack_00000047,
                     in_stack_000000b0,in_stack_000000b8,in_stack_000000c0,in_stack_000000c8,
                     in_stack_000000d0,in_stack_000000d8,in_stack_000000e0,in_stack_00000038,
                     (MissingAction)ix_1,(size_t *)xlow,in_stack_000000f8,in_stack_00000037,
                     (double *)ix,tot,(double *)ignored,
                     (size_t *)CONCAT17(force_cols_use,in_stack_00000120),(size_t *)min_gain);
  return dVar6;
}

Assistant:

double eval_guided_crit(size_t ix_arr[], size_t st, size_t end,
                        size_t col_num, real_t_ Xc[], sparse_ix Xc_ind[], sparse_ix Xc_indptr[],
                        double buffer_arr[], size_t buffer_pos[], bool as_relative_gain,
                        double *restrict saved_xmedian,
                        double &split_point, double &xmin, double &xmax,
                        GainCriterion criterion, double min_gain, MissingAction missing_action,
                        size_t *restrict cols_use, size_t ncols_use, bool force_cols_use,
                        double *restrict X_row_major, size_t ncols,
                        double *restrict Xr, size_t *restrict Xr_ind, size_t *restrict Xr_indptr)
{
    size_t ignored;


    todense(ix_arr, st, end,
            col_num, Xc, Xc_ind, Xc_indptr,
            buffer_arr);
    size_t tot = end - st + 1;
    std::iota(buffer_pos, buffer_pos + tot, (size_t)0);

    if (missing_action == Impute)
    {
        missing_action = Fail;
        for (size_t ix = 0; ix < tot; ix++)
        {
            if (unlikely(is_na_or_inf(buffer_arr[ix])))
            {
                goto fill_missing;
            }
        }
        goto no_nas;

        fill_missing:
        {
            size_t idx_half = div2(tot);
            std::nth_element(buffer_pos, buffer_pos + idx_half, buffer_pos + tot,
                             [&buffer_arr](const size_t a, const size_t b){return buffer_arr[a] < buffer_arr[b];});
            *saved_xmedian = buffer_arr[buffer_pos[idx_half]];

            if ((tot % 2) == 0)
            {
                double xlow = *std::max_element(buffer_pos, buffer_pos + idx_half);
                *saved_xmedian = xlow + ((*saved_xmedian)-xlow)/2.;
            }

            for (size_t ix = 0; ix < tot; ix++)
                buffer_arr[ix] = is_na_or_inf(buffer_arr[ix])? (*saved_xmedian) : buffer_arr[ix];
            std::iota(buffer_pos, buffer_pos + tot, (size_t)0);
        }
    }

    no_nas:
    return eval_guided_crit<double, ldouble_safe>(
                            buffer_pos, 0, end - st, buffer_arr, buffer_arr + tot,
                            as_relative_gain, saved_xmedian, (double*)NULL, ignored, split_point,
                            xmin, xmax, criterion, min_gain, missing_action,
                            cols_use, ncols_use, force_cols_use,
                            X_row_major, ncols,
                            Xr, Xr_ind, Xr_indptr);
}